

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qset.h
# Opt level: O0

QSet<QWidget_*> * __thiscall QSet<QWidget_*>::unite(QSet<QWidget_*> *this,QSet<QWidget_*> *other)

{
  long lVar1;
  bool bVar2;
  iterator *this_00;
  qsizetype qVar3;
  QSet<QWidget_*> *in_RSI;
  QSet<QWidget_*> *in_RDI;
  long in_FS_OFFSET;
  QWidget **e_1;
  add_const_t<QSet<QWidget_*>_> *__range3_1;
  QWidget **e;
  QSet<QWidget_*> *__range3;
  const_iterator __end0_1;
  const_iterator __begin0_1;
  iterator __end0;
  iterator __begin0;
  iterator *in_stack_ffffffffffffff68;
  QSet<QWidget_*> *in_stack_ffffffffffffff80;
  QSet<QWidget_*> *in_stack_ffffffffffffff88;
  QSet<QWidget_*> *local_50;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = isDetached((QSet<QWidget_*> *)0x58878a);
  if (bVar2) {
    this_00 = (iterator *)size((QSet<QWidget_*> *)0x58879d);
    qVar3 = size((QSet<QWidget_*> *)0x5887ac);
    if ((long)this_00 < qVar3) {
      swap((QSet<QWidget_*> *)this_00,(QSet<QWidget_*> *)in_stack_ffffffffffffff68);
      bVar2 = isDetached((QSet<QWidget_*> *)0x5887d6);
      local_50 = in_RDI;
      if (bVar2) {
        begin(in_stack_ffffffffffffff88);
        end(in_stack_ffffffffffffff88);
        while (bVar2 = iterator::operator!=(this_00,in_stack_ffffffffffffff68), bVar2) {
          iterator::operator*((iterator *)0x588883);
          QSet<QWidget*>::_emplace_or_overwrite<QWidget*const>
                    ((QSet<QWidget_*> *)this_00,(QWidget **)in_stack_ffffffffffffff68);
          iterator::operator++(this_00);
        }
      }
      else {
        begin(in_RSI);
        end(in_RSI);
        while (bVar2 = const_iterator::operator!=
                                 ((const_iterator *)this_00,
                                  (const_iterator *)in_stack_ffffffffffffff68), bVar2) {
          const_iterator::operator*((const_iterator *)0x588940);
          QSet<QWidget*>::_emplace_or_overwrite<QWidget*const&>
                    ((QSet<QWidget_*> *)this_00,(QWidget **)in_stack_ffffffffffffff68);
          const_iterator::operator++((const_iterator *)this_00);
        }
      }
      goto LAB_00588982;
    }
  }
  local_50 = unite(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
LAB_00588982:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_50;
}

Assistant:

Q_INLINE_TEMPLATE auto QSet<T>::unite(QSet &&other) -> QSet&
{
    if (other.isDetached() && size() < other.size()) {

        // We can change the state of `other`, so take the smaller *this and
        // insert it into the larger `other`, making sure we take equivalent
        // elements from *this:

        swap(other);

        // Now: iterate over `other`, insert into *this, making sure we take
        //      equivalent elements from `other`:

        if (other.isDetached()) { // can move elements from `other`
            for (auto &e : other)
                _emplace_or_overwrite(std::move(e));
        } else { // need to copy elements from `other`
            for (const auto &e : std::as_const(other))
                _emplace_or_overwrite(e);
        }

        return *this;
    }

    // in all other cases, the lvalue overload is not worse:
    return unite(other);
}